

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

ExecutionModel stage_to_execution_model(string *stage)

{
  bool bVar1;
  CompilerError *this;
  allocator local_39;
  string local_38 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *stage_local;
  
  local_18 = stage;
  bVar1 = std::operator==(stage,"vert");
  if (bVar1) {
    stage_local._4_4_ = ExecutionModelVertex;
  }
  else {
    bVar1 = std::operator==(local_18,"frag");
    if (bVar1) {
      stage_local._4_4_ = ExecutionModelFragment;
    }
    else {
      bVar1 = std::operator==(local_18,"comp");
      if (bVar1) {
        stage_local._4_4_ = ExecutionModelGLCompute;
      }
      else {
        bVar1 = std::operator==(local_18,"tesc");
        if (bVar1) {
          stage_local._4_4_ = ExecutionModelTessellationControl;
        }
        else {
          bVar1 = std::operator==(local_18,"tese");
          if (bVar1) {
            stage_local._4_4_ = ExecutionModelTessellationEvaluation;
          }
          else {
            bVar1 = std::operator==(local_18,"geom");
            if (!bVar1) {
              this = (CompilerError *)__cxa_allocate_exception(0x10);
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_38,"Invalid stage.",&local_39);
              spirv_cross::CompilerError::CompilerError(this,(string *)local_38);
              __cxa_throw(this,&spirv_cross::CompilerError::typeinfo,
                          spirv_cross::CompilerError::~CompilerError);
            }
            stage_local._4_4_ = ExecutionModelGeometry;
          }
        }
      }
    }
  }
  return stage_local._4_4_;
}

Assistant:

static ExecutionModel stage_to_execution_model(const std::string &stage)
{
	if (stage == "vert")
		return ExecutionModelVertex;
	else if (stage == "frag")
		return ExecutionModelFragment;
	else if (stage == "comp")
		return ExecutionModelGLCompute;
	else if (stage == "tesc")
		return ExecutionModelTessellationControl;
	else if (stage == "tese")
		return ExecutionModelTessellationEvaluation;
	else if (stage == "geom")
		return ExecutionModelGeometry;
	else
		SPIRV_CROSS_THROW("Invalid stage.");
}